

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_endpointer.c
# Opt level: O0

int16 * ps_endpointer_process(ps_endpointer_t *ep,int16 *frame)

{
  int iVar1;
  ps_vad_class_t is_speech_00;
  int16 *piVar2;
  int16 *pcm;
  int speech_count;
  int is_speech;
  int16 *frame_local;
  ps_endpointer_t *ep_local;
  
  if ((ep == (ps_endpointer_t *)0x0) || (ep->vad == (ps_vad_t *)0x0)) {
    ep_local = (ps_endpointer_t *)0x0;
  }
  else {
    if ((ep->in_speech != 0) && (iVar1 = ep_full(ep), iVar1 != 0)) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
              ,0x126,"VAD queue overflow (should not happen)");
    }
    is_speech_00 = ps_vad_classify(ep->vad,frame);
    ep_push(ep,is_speech_00,frame);
    ep->timestamp = ep->frame_length + ep->timestamp;
    iVar1 = ep_speech_count(ep);
    if (ep->in_speech == 0) {
      if (ep->start_frames < iVar1) {
        ep->speech_start = ep->qstart_time;
        ep->speech_end = 0.0;
        ep->in_speech = 1;
      }
    }
    else if (iVar1 < ep->end_frames) {
      piVar2 = ep_pop(ep,(int *)0x0);
      ep->speech_end = ep->qstart_time;
      ep->in_speech = 0;
      return piVar2;
    }
    if (ep->in_speech == 0) {
      ep_local = (ps_endpointer_t *)0x0;
    }
    else {
      ep_local = (ps_endpointer_t *)ep_pop(ep,(int *)0x0);
    }
  }
  return (int16 *)ep_local;
}

Assistant:

const int16 *
ps_endpointer_process(ps_endpointer_t *ep,
                      const int16 *frame)
{
    int is_speech, speech_count;
    if (ep == NULL || ep->vad == NULL)
        return NULL;
    if (ep->in_speech && ep_full(ep)) {
        E_ERROR("VAD queue overflow (should not happen)");
        /* Not fatal, we just lose data. */
    }
    is_speech = ps_vad_classify(ep->vad, frame);
    ep_push(ep, is_speech, frame);
    ep->timestamp += ep->frame_length;
    speech_count = ep_speech_count(ep);
    E_DEBUG("%.2f %d %d %d\n", ep->timestamp, speech_count,
            ep->start_frames, ep->end_frames);
    if (ep->in_speech) {
        if (speech_count < ep->end_frames) {
            /* Return only the first frame.  Either way it's sort of
               arbitrary, but this avoids having to drain the queue to
               prevent overlapping segments.  It's also closer to what
               human annotators will do. */
            int16 *pcm = ep_pop(ep, NULL);
            ep->speech_end = ep->qstart_time;
            ep->in_speech = FALSE;
            return pcm;
        }
    }
    else {
        if (speech_count > ep->start_frames) {
            ep->speech_start = ep->qstart_time;
            ep->speech_end = 0;
            ep->in_speech = TRUE;
        }
    }
    if (ep->in_speech)
        return ep_pop(ep, NULL);
    else
        return NULL;
}